

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O2

MPP_RET vcodec_service_cmd_send(void *ctx)

{
  uint *puVar1;
  void *regs;
  MPP_RET MVar2;
  char *pcVar3;
  MPP_RET *pMVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint *puVar9;
  long lVar10;
  uint uVar11;
  
  lVar10 = (long)*(int *)((long)ctx + 0x1c) * 0xa0;
  regs = *(void **)((long)ctx + lVar10 + 0xb8);
  uVar11 = *(uint *)((long)ctx + lVar10 + 0x28);
  uVar7 = *(uint *)((long)ctx + lVar10 + 0x30);
  if (uVar7 != 0) {
    puVar9 = (uint *)((long)ctx + lVar10 + 0x28);
    pcVar3 = strstr((char *)((long)ctx + 8),"mjpeg");
    if (pcVar3 == (char *)0x0) {
      for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
        puVar1 = (uint *)((long)regs + (ulong)*(uint *)((long)ctx + uVar6 * 8 + lVar10 + 0x34) * 4);
        *puVar1 = *puVar1 | *(int *)((long)ctx + uVar6 * 8 + lVar10 + 0x38) << 10;
        uVar7 = *(uint *)((long)ctx + lVar10 + 0x30);
      }
      uVar11 = *puVar9;
    }
    else {
      memcpy((void *)((ulong)uVar11 + (long)regs),(void *)((long)ctx + lVar10 + 0x2c),0x88);
      uVar11 = *puVar9 + 0x88;
      *puVar9 = uVar11;
      *(undefined4 *)((long)ctx + lVar10 + 0x2c) = 0x4c4a46;
    }
    *(undefined4 *)((long)ctx + lVar10 + 0x30) = 0;
  }
  uVar11 = vcodec_service_ioctl(*(RK_S32 *)((long)ctx + 0x10),0x40086c03,regs,uVar11);
  MVar2 = MPP_OK;
  if (uVar11 != 0) {
    pMVar4 = __errno_location();
    MVar2 = *pMVar4;
    pcVar3 = strerror(MVar2);
    _mpp_log_l(2,"vcodec_service","ioctl VPU_IOC_SET_REG failed ret %d errno %d %s\n",
               "vcodec_service_cmd_send",(ulong)uVar11,(ulong)(uint)MVar2,pcVar3);
    MVar2 = *pMVar4;
  }
  iVar5 = *(int *)((long)ctx + 0x1c) + 1;
  iVar8 = 0;
  if (iVar5 < *(int *)((long)ctx + 0x14)) {
    iVar8 = iVar5;
  }
  *(int *)((long)ctx + 0x1c) = iVar8;
  *(undefined4 *)((long)ctx + 0x208) = 0;
  return MVar2;
}

Assistant:

MPP_RET vcodec_service_cmd_send(void *ctx)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;
    VcodecRegCfg *send_cfg = &p->regs[p->reg_send_idx];
    VcodecExtraInfo *extra = &send_cfg->extra_info;
    void *reg_set = send_cfg->reg_set;
    char *fmt = (char*)&p->fmt;

    update_extra_info(extra, fmt, send_cfg);

    MPP_RET ret = vcodec_service_ioctl(p->fd, VPU_IOC_SET_REG,
                                       reg_set, send_cfg->reg_size);
    if (ret) {
        mpp_err_f("ioctl VPU_IOC_SET_REG failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
        ret = errno;
    }

    p->reg_send_idx++;
    if (p->reg_send_idx >= p->max_regs)
        p->reg_send_idx = 0;
    p->info_count = 0;

    return ret;
}